

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O2

lws * lws_create_new_server_wsi(lws_vhost *vhost,int fixed_tsi)

{
  byte *pbVar1;
  int *piVar2;
  uint uVar3;
  lws_context *plVar4;
  lws *wsi;
  uint *puVar5;
  uint uVar6;
  char *format;
  long lVar7;
  bool bVar8;
  bool bVar9;
  
  if (fixed_tsi < 0) {
    plVar4 = vhost->context;
    puVar5 = &plVar4->pt[0].fds_count;
    uVar6 = 0xffffffff;
    fixed_tsi = -1;
    for (lVar7 = 0; lVar7 < plVar4->count_threads; lVar7 = lVar7 + 1) {
      _lws_log(0x10,"%s: %d %d\n","lws_get_idlest_tsi",(ulong)*puVar5,
               (ulong)(plVar4->fd_limit_per_thread - 1));
      uVar3 = *puVar5;
      bVar9 = uVar3 != plVar4->fd_limit_per_thread - 1;
      bVar8 = uVar3 < uVar6;
      if (bVar9 && bVar8) {
        uVar6 = uVar3;
      }
      if (bVar9 && bVar8) {
        fixed_tsi = (int)lVar7;
      }
      puVar5 = puVar5 + 0x62;
    }
    if (fixed_tsi < 0) {
      format = "no space for new conn\n";
      goto LAB_0013574c;
    }
  }
  wsi = (lws *)lws_zalloc(0x300,"new server wsi");
  if (wsi != (lws *)0x0) {
    pbVar1 = (byte *)((long)&wsi->wsistate + 3);
    *pbVar1 = *pbVar1 | 0x20;
    wsi->tsi = (char)fixed_tsi;
    _lws_log(0x10,"new wsi %p joining vhost %s, tsi %d\n",wsi,vhost->name,
             (ulong)(uint)(int)(char)fixed_tsi);
    lws_vhost_bind_wsi(vhost,wsi);
    wsi->context = vhost->context;
    wsi->pending_timeout = '\0';
    *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffffffffff9fff | 0x2000;
    wsi->retry_policy = vhost->retry_policy;
    lwsi_set_state(wsi,0x200);
    wsi->field_0x2dc = wsi->field_0x2dc & 0xfe;
    (wsi->tls).use_ssl = (uint)((vhost->tls).use_ssl != 0);
    wsi->protocol = vhost->protocols;
    wsi->user_space = (void *)0x0;
    (wsi->desc).sockfd = -1;
    wsi->position_in_fds_table = -1;
    piVar2 = &vhost->context->count_wsi_allocated;
    *piVar2 = *piVar2 + 1;
    (*vhost->protocols->callback)(wsi,LWS_CALLBACK_WSI_CREATE,(void *)0x0,(void *)0x0,0);
    return wsi;
  }
  format = "Out of memory for new connection\n";
LAB_0013574c:
  _lws_log(1,format);
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_create_new_server_wsi(struct lws_vhost *vhost, int fixed_tsi)
{
	struct lws *new_wsi;
	int n = fixed_tsi;

	if (n < 0)
		n = lws_get_idlest_tsi(vhost->context);

	if (n < 0) {
		lwsl_err("no space for new conn\n");
		return NULL;
	}

	new_wsi = lws_zalloc(sizeof(struct lws), "new server wsi");
	if (new_wsi == NULL) {
		lwsl_err("Out of memory for new connection\n");
		return NULL;
	}

	new_wsi->wsistate |= LWSIFR_SERVER;
	new_wsi->tsi = n;
	lwsl_debug("new wsi %p joining vhost %s, tsi %d\n", new_wsi,
		   vhost->name, new_wsi->tsi);

	lws_vhost_bind_wsi(vhost, new_wsi);
	new_wsi->context = vhost->context;
	new_wsi->pending_timeout = NO_PENDING_TIMEOUT;
	new_wsi->rxflow_change_to = LWS_RXFLOW_ALLOW;
	new_wsi->retry_policy = vhost->retry_policy;

#if defined(LWS_WITH_DETAILED_LATENCY)
	if (vhost->context->detailed_latency_cb)
		new_wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif

	/* initialize the instance struct */

	lwsi_set_state(new_wsi, LRS_UNCONNECTED);
	new_wsi->hdr_parsing_completed = 0;

#ifdef LWS_WITH_TLS
	new_wsi->tls.use_ssl = LWS_SSL_ENABLED(vhost);
#endif

	/*
	 * these can only be set once the protocol is known
	 * we set an un-established connection's protocol pointer
	 * to the start of the supported list, so it can look
	 * for matching ones during the handshake
	 */
	new_wsi->protocol = vhost->protocols;
	new_wsi->user_space = NULL;
	new_wsi->desc.sockfd = LWS_SOCK_INVALID;
	new_wsi->position_in_fds_table = LWS_NO_FDS_POS;

	vhost->context->count_wsi_allocated++;

	/*
	 * outermost create notification for wsi
	 * no user_space because no protocol selection
	 */
	vhost->protocols[0].callback(new_wsi, LWS_CALLBACK_WSI_CREATE, NULL,
				     NULL, 0);

	return new_wsi;
}